

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O0

int Test_SUNLinSolSetPreconditioner
              (SUNLinearSolver S,void *Pdata,PSetupFn PSetup,PSolveFn PSolve,int myid)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double stop_time;
  double start_time;
  int failure;
  int myid_local;
  PSolveFn PSolve_local;
  PSetupFn PSetup_local;
  void *Pdata_local;
  SUNLinearSolver S_local;
  
  dVar2 = get_time();
  uVar1 = SUNLinSolSetPreconditioner(S,Pdata,PSetup,PSolve);
  dVar3 = get_time();
  if (uVar1 == 0) {
    if ((myid == 0) && (printf("    PASSED test -- SUNLinSolSetPreconditioner \n"), print_time != 0)
       ) {
      printf("    SUNLinSolSetPreconditioner Time: %22.15e \n \n",dVar3 - dVar2);
    }
    S_local._4_4_ = 0;
  }
  else {
    printf(">>> FAILED test -- SUNLinSolSetPreconditioner returned %d on Proc %d \n",(ulong)uVar1,
           (ulong)(uint)myid);
    S_local._4_4_ = 1;
  }
  return S_local._4_4_;
}

Assistant:

int Test_SUNLinSolSetPreconditioner(SUNLinearSolver S, void *Pdata,
                                    PSetupFn PSetup, PSolveFn PSolve, int myid)
{
  int       failure;
  double    start_time, stop_time;

  /* try calling SetPreconditioner routine: should pass/fail based on expected input */
  start_time = get_time();
  failure = SUNLinSolSetPreconditioner(S, Pdata, PSetup, PSolve);
  stop_time = get_time(); 

  if (failure) {
    printf(">>> FAILED test -- SUNLinSolSetPreconditioner returned %d on Proc %d \n", 
           failure, myid);
    return(1);
  }
  else if (myid == 0) {
    printf("    PASSED test -- SUNLinSolSetPreconditioner \n");
    PRINT_TIME("    SUNLinSolSetPreconditioner Time: %22.15e \n \n", stop_time - start_time);
  }    

  return(0);
}